

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmsg.c
# Opt level: O2

int main(int argc,char **argv)

{
  uint uVar1;
  int line;
  int iVar2;
  int iVar3;
  long *plVar4;
  uint *puVar5;
  int sock;
  int sock_00;
  int sock_01;
  int sock_02;
  int sock_03;
  int sock_04;
  FILE *pFVar6;
  char *__format;
  char *pcVar7;
  undefined8 uStackY_200;
  undefined4 uVar8;
  uchar body [3];
  nn_iovec iovec;
  nn_msghdr hdr;
  void *buf;
  char socket_address [128];
  uchar ctrl [256];
  
  if (argc < 2) {
    pcVar7 = "5555";
  }
  else {
    pcVar7 = argv[1];
  }
  uVar1 = atoi(pcVar7);
  pcVar7 = "127.0.0.1";
  sprintf(socket_address,"%s://%s:%d","tcp","127.0.0.1",(ulong)uVar1);
  line = test_socket_impl((char *)0x30,2,0x31,(int)pcVar7);
  iVar2 = nn_bind(line,socket_address);
  pFVar6 = _stderr;
  if (iVar2 < 0) {
    puVar5 = (uint *)__errno_location();
    pcVar7 = nn_err_strerror(*puVar5);
    uVar1 = *puVar5;
    uVar8 = 0x31;
    __format = "Failed bind to \"%s\": %s [%d] (%s:%d)\n";
LAB_0010179f:
    fprintf(pFVar6,__format,socket_address,pcVar7,(ulong)uVar1,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/cmsg.c",
            uVar8);
    nn_err_abort();
  }
  iVar2 = test_socket_impl((char *)0x32,1,0x30,(int)pcVar7);
  iVar3 = nn_connect(iVar2,socket_address);
  pFVar6 = _stderr;
  if (iVar3 < 0) {
    puVar5 = (uint *)__errno_location();
    pcVar7 = nn_err_strerror(*puVar5);
    uVar1 = *puVar5;
    uVar8 = 0x33;
    __format = "Failed connect to \"%s\": %s [%d] (%s:%d)\n";
    goto LAB_0010179f;
  }
  test_send_impl((char *)0x37,iVar2,sock,pcVar7);
  iovec.iov_len = 3;
  hdr.msg_iovlen = 1;
  hdr.msg_control = ctrl;
  hdr.msg_controllen = 0x100;
  iovec.iov_base = body;
  hdr.msg_iov = &iovec;
  iVar3 = nn_recvmsg(line,&hdr,0);
  pFVar6 = _stderr;
  if (iVar3 == 3) {
    plVar4 = (long *)0x0;
    do {
      plVar4 = (long *)nn_cmsg_nxthdr_(&hdr,plVar4);
      if (plVar4 == (long *)0x0) {
        pcVar7 = "cmsg";
        uStackY_200 = 0x44;
        goto LAB_00101592;
      }
    } while (((int)plVar4[1] != 1) || (*(int *)((long)plVar4 + 0xc) != 1));
    if (*plVar4 == 0x20) {
      if ((char)plVar4[3] < '\0') {
        pcVar7 = "!(data[0+sizeof (size_t)] & 0x80)";
        uStackY_200 = 0x4b;
      }
      else if (*(char *)((long)plVar4 + 0x1c) < '\0') {
        iVar3 = nn_sendmsg(line,&hdr,0);
        if (iVar3 == 3) {
          test_recv_impl((char *)0x50,iVar2,sock_00,pcVar7);
          test_send_impl((char *)0x54,iVar2,sock_01,pcVar7);
          iovec.iov_len = 3;
          hdr.msg_iovlen = 1;
          hdr.msg_control = &buf;
          hdr.msg_controllen = 0xffffffffffffffff;
          iovec.iov_base = body;
          hdr.msg_iov = &iovec;
          iVar3 = nn_recvmsg(line,&hdr,0);
          pFVar6 = _stderr;
          if (iVar3 != 3) {
            puVar5 = (uint *)__errno_location();
            pcVar7 = nn_err_strerror(*puVar5);
            uVar1 = *puVar5;
            uStackY_200 = 0x5d;
            goto LAB_0010169a;
          }
          plVar4 = (long *)0x0;
          do {
            plVar4 = (long *)nn_cmsg_nxthdr_(&hdr,plVar4);
            if (plVar4 == (long *)0x0) {
              pcVar7 = "cmsg";
              uStackY_200 = 0x61;
              goto LAB_00101592;
            }
          } while (((int)plVar4[1] != 1) || (*(int *)((long)plVar4 + 0xc) != 1));
          if (*plVar4 == 0x20) {
            if ((char)plVar4[3] < '\0') {
              pcVar7 = "!(data[0+sizeof (size_t)] & 0x80)";
              uStackY_200 = 0x68;
            }
            else if (*(char *)((long)plVar4 + 0x1c) < '\0') {
              iVar3 = nn_sendmsg(line,&hdr,0);
              if (iVar3 == 3) {
                test_recv_impl((char *)0x6d,iVar2,sock_02,pcVar7);
                test_close_impl((char *)0x6f,iVar2,sock_03);
                test_close_impl((char *)0x70,line,sock_04);
                return 0;
              }
              pcVar7 = "rc == 3";
              uStackY_200 = 0x6c;
            }
            else {
              pcVar7 = "data[4+sizeof (size_t)] & 0x80";
              uStackY_200 = 0x69;
            }
          }
          else {
            pcVar7 = "cmsg->cmsg_len == NN_CMSG_SPACE (8+sizeof (size_t))";
            uStackY_200 = 0x66;
          }
        }
        else {
          pcVar7 = "rc == 3";
          uStackY_200 = 0x4f;
        }
      }
      else {
        pcVar7 = "data[4+sizeof (size_t)] & 0x80";
        uStackY_200 = 0x4c;
      }
    }
    else {
      pcVar7 = "cmsg->cmsg_len == NN_CMSG_SPACE (8+sizeof (size_t))";
      uStackY_200 = 0x49;
    }
LAB_00101592:
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",pcVar7,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/cmsg.c",
            uStackY_200);
  }
  else {
    puVar5 = (uint *)__errno_location();
    pcVar7 = nn_err_strerror(*puVar5);
    uVar1 = *puVar5;
    uStackY_200 = 0x40;
LAB_0010169a:
    fprintf(pFVar6,"%s [%d] (%s:%d)\n",pcVar7,(ulong)uVar1,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/cmsg.c",
            uStackY_200);
  }
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

int main (int argc, const char *argv[])
{
    int rc;
    int rep;
    int req;
    struct nn_msghdr hdr;
    struct nn_iovec iovec;
    unsigned char body [3];
    unsigned char ctrl [256];
    struct nn_cmsghdr *cmsg;
    unsigned char *data;
    void *buf;
    char socket_address[128];

    test_addr_from(socket_address, "tcp", "127.0.0.1",
            get_test_port(argc, argv));
    
    rep = test_socket (AF_SP_RAW, NN_REP);
    test_bind (rep, socket_address);
    req = test_socket (AF_SP, NN_REQ);
    test_connect (req, socket_address);

    /* Test ancillary data in static buffer. */

    test_send (req, "ABC");

    iovec.iov_base = body;
    iovec.iov_len = sizeof (body);
    hdr.msg_iov = &iovec;
    hdr.msg_iovlen = 1;
    hdr.msg_control = ctrl;
    hdr.msg_controllen = sizeof (ctrl);
    rc = nn_recvmsg (rep, &hdr, 0);
    errno_assert (rc == 3);

    cmsg = NN_CMSG_FIRSTHDR (&hdr);
    while (1) {
        nn_assert (cmsg);
        if (cmsg->cmsg_level == PROTO_SP && cmsg->cmsg_type == SP_HDR)
            break;
        cmsg = NN_CMSG_NXTHDR (&hdr, cmsg);
    }
    nn_assert (cmsg->cmsg_len == NN_CMSG_SPACE (8+sizeof (size_t)));
    data = NN_CMSG_DATA (cmsg);
    nn_assert (!(data[0+sizeof (size_t)] & 0x80));
    nn_assert (data[4+sizeof (size_t)] & 0x80);

    rc = nn_sendmsg (rep, &hdr, 0);
    nn_assert (rc == 3);
    test_recv (req, "ABC");

    /* Test ancillary data in dynamically allocated buffer (NN_MSG). */

    test_send (req, "ABC");

    iovec.iov_base = body;
    iovec.iov_len = sizeof (body);
    hdr.msg_iov = &iovec;
    hdr.msg_iovlen = 1;
    hdr.msg_control = &buf;
    hdr.msg_controllen = NN_MSG;
    rc = nn_recvmsg (rep, &hdr, 0);
    errno_assert (rc == 3);

    cmsg = NN_CMSG_FIRSTHDR (&hdr);
    while (1) {
        nn_assert (cmsg);
        if (cmsg->cmsg_level == PROTO_SP && cmsg->cmsg_type == SP_HDR)
            break;
        cmsg = NN_CMSG_NXTHDR (&hdr, cmsg);
    }
    nn_assert (cmsg->cmsg_len == NN_CMSG_SPACE (8+sizeof (size_t)));
    data = NN_CMSG_DATA (cmsg);
    nn_assert (!(data[0+sizeof (size_t)] & 0x80));
    nn_assert (data[4+sizeof (size_t)] & 0x80);

    rc = nn_sendmsg (rep, &hdr, 0);
    nn_assert (rc == 3);
    test_recv (req, "ABC");

    test_close (req);
    test_close (rep);

    return 0;
}